

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O1

void __thiscall baryonyx::pnm_vector::pnm_vector(pnm_vector *this,string *filename,uint m,long loop)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  char cVar2;
  _Head_base<0UL,_unsigned_char_*,_false> __s;
  pointer *__ptr;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  ulong uVar3;
  format_args args;
  string_view format_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  string local_78;
  long local_58 [2];
  long local_48;
  undefined8 local_38;
  
  (this->m_buffer)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  std::ofstream::ofstream(&this->m_ofs,(string *)filename,_S_bin);
  this->m_heigth = loop;
  uVar3 = (ulong)m;
  this->m_width = uVar3;
  cVar2 = std::__basic_file<char>::is_open();
  if ((cVar2 != '\0') && (0 < (long)(loop * uVar3))) {
    __s._M_head_impl = (uchar *)operator_new__(uVar3 * 3);
    memset(__s._M_head_impl,0,uVar3 * 3);
    _Var1._M_head_impl =
         (this->m_buffer)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (this->m_buffer)._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s._M_head_impl;
    if (_Var1._M_head_impl != (uchar *)0x0) {
      operator_delete__(_Var1._M_head_impl);
    }
    local_48 = this->m_heigth;
    local_58[0] = this->m_width;
    local_38 = 0xff;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_58;
    format_str.size_ = 0x133;
    format_str.data_ = (char *)0xc;
    ::fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)"P6 {} {} {} ",format_str,args);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->m_ofs,local_78._M_dataplus._M_p,local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

pnm_vector(std::string filename, unsigned int m, long int loop)
      : m_ofs(filename, std::ios::binary)
      , m_heigth(loop)
      , m_width(m)
    {
        if (!m_ofs.is_open())
            return;

        if (m_heigth * m_width > 0) {
            m_buffer = std::make_unique<std::uint8_t[]>(size());

            auto header{ fmt::format("P6 {} {} {} ", m_width, m_heigth, 255) };
            m_ofs << header;
        }
    }